

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O2

void UnityAssertEqualFloatArray
               (UNITY_FLOAT *expected,UNITY_FLOAT *actual,UNITY_UINT32 num_elements,char *msg,
               UNITY_UINT lineNumber,UNITY_FLAGS_T flags)

{
  int iVar1;
  UNITY_UINT number;
  
  if (Unity.CurrentTestIgnored != 0 || Unity.CurrentTestFailed != 0) goto LAB_00101f89;
  if (num_elements == 0) {
    UnityTestResultsFailBegin(lineNumber);
    UnityPrint(" You Asked Me To Compare Nothing, Which Was Pointless.");
LAB_00101f75:
    UnityAddMsgIfSpecified(msg);
  }
  else {
    if (expected == actual) {
      return;
    }
    iVar1 = UnityIsOneArrayNull(expected,actual,lineNumber,msg);
    if (iVar1 == 0) {
      number = 0;
      while( true ) {
        if (num_elements == (UNITY_UINT32)number) {
          return;
        }
        iVar1 = UnityFloatsWithin(*expected * 1e-05,*expected,actual[number]);
        if (iVar1 == 0) break;
        expected = expected + (flags == UNITY_ARRAY_TO_ARRAY);
        number = number + 1;
      }
      UnityTestResultsFailBegin(lineNumber);
      UnityPrint(" Element ");
      UnityPrintNumberUnsigned(number);
      UnityPrint(" Expected ");
      UnityPrintFloat(*expected);
      UnityPrint(" Was ");
      UnityPrintFloat(actual[number]);
      goto LAB_00101f75;
    }
  }
  Unity.CurrentTestFailed = 1;
LAB_00101f89:
  longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
}

Assistant:

void UnityAssertEqualFloatArray(UNITY_PTR_ATTRIBUTE const UNITY_FLOAT* expected,
                                UNITY_PTR_ATTRIBUTE const UNITY_FLOAT* actual,
                                const UNITY_UINT32 num_elements,
                                const char* msg,
                                const UNITY_LINE_TYPE lineNumber,
                                const UNITY_FLAGS_T flags)
{
    UNITY_UINT32 elements = num_elements;
    UNITY_PTR_ATTRIBUTE const UNITY_FLOAT* ptr_expected = expected;
    UNITY_PTR_ATTRIBUTE const UNITY_FLOAT* ptr_actual = actual;

    RETURN_IF_FAIL_OR_IGNORE;

    if (elements == 0)
    {
        UnityPrintPointlessAndBail();
    }

    if (expected == actual)
    {
        return; /* Both are NULL or same pointer */
    }

    if (UnityIsOneArrayNull((UNITY_INTERNAL_PTR)expected, (UNITY_INTERNAL_PTR)actual, lineNumber, msg))
    {
        UNITY_FAIL_AND_BAIL;
    }

    while (elements--)
    {
        if (!UnityFloatsWithin(*ptr_expected * UNITY_FLOAT_PRECISION, *ptr_expected, *ptr_actual))
        {
            UnityTestResultsFailBegin(lineNumber);
            UnityPrint(UnityStrElement);
            UnityPrintNumberUnsigned(num_elements - elements - 1);
            UNITY_PRINT_EXPECTED_AND_ACTUAL_FLOAT((UNITY_DOUBLE)*ptr_expected, (UNITY_DOUBLE)*ptr_actual);
            UnityAddMsgIfSpecified(msg);
            UNITY_FAIL_AND_BAIL;
        }
        if (flags == UNITY_ARRAY_TO_ARRAY)
        {
            ptr_expected++;
        }
        ptr_actual++;
    }
}